

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O1

void __thiscall read_single_file::test_method(read_single_file *this)

{
  bool bVar1;
  undefined1 local_198 [32];
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  undefined4 local_154;
  undefined **local_150;
  ulong local_148;
  shared_count sStack_140;
  long **local_138;
  EventRegistry registry;
  long local_118;
  LicenseReader licenseReader;
  long *local_f0;
  undefined4 *local_e8;
  undefined1 local_e0;
  undefined8 local_d8;
  shared_count sStack_d0;
  undefined **local_c8;
  char *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  LicenseLocation location;
  
  location.licenseFileLocation =
       "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/test_reader.ini"
  ;
  location.environmentVariableName = (char *)0x0;
  location.openFileNearModule = false;
  license::LicenseReader::LicenseReader(&licenseReader,&location);
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198._0_8_ = local_198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"PrODUCT","");
  license::LicenseReader::readLicenses(&registry,&licenseReader,(string *)local_198,&licenseInfos);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_);
  }
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x13);
  bVar1 = license::EventRegistry::isGood(&registry);
  local_150 = (undefined **)CONCAT71(local_150._1_7_,bVar1);
  local_148 = 0;
  sStack_140.pi_ = (sp_counted_base *)0x0;
  local_198._24_8_ = &local_c8;
  local_c8 = (undefined **)0x47b0f6;
  local_c0 = "";
  local_198[8] = 0;
  local_198._0_8_ = &PTR__lazy_ostream_0059be90;
  local_198._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_80 = "";
  boost::test_tools::tt_detail::report_assertion(&local_150,local_198,&local_88,0x13,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_140);
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x14);
  local_c0 = (char *)((ulong)local_c0 & 0xffffffffffffff00);
  local_c8 = &PTR__lazy_ostream_0059bf08;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = "";
  local_e8 = &local_154;
  local_154 = 1;
  local_118 = (long)licenseInfos.
                    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)licenseInfos.
                    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 8;
  local_f0 = &local_118;
  local_e0 = (long)licenseInfos.
                   super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)licenseInfos.
                   super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0x100;
  local_d8 = 0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_50 = "";
  local_198._24_8_ = &local_e8;
  local_198[8] = 0;
  local_198._0_8_ = &PTR__lazy_ostream_0059bf48;
  local_198._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_f0;
  local_148 = local_148 & 0xffffffffffffff00;
  local_150 = &PTR__lazy_ostream_0059bf88;
  sStack_140.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d0);
  if (registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            (&licenseInfos);
  license::LicenseReader::~LicenseReader(&licenseReader);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( read_single_file ) {
	const char * licLocation =
	PROJECT_TEST_SRC_DIR "/library/test_reader.ini";
	const LicenseLocation location = { licLocation, NULL, false };
	LicenseReader licenseReader(location);
	vector<FullLicenseInfo> licenseInfos;
	EventRegistry registry = licenseReader.readLicenses("PrODUCT",
			licenseInfos);
	BOOST_CHECK(registry.isGood());
	BOOST_CHECK_EQUAL(1, licenseInfos.size());
}